

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_socket.cpp
# Opt level: O3

void __thiscall cppnet::ConnectSocket::~ConnectSocket(ConnectSocket *this)

{
  ~ConnectSocket(this);
  operator_delete(this);
  return;
}

Assistant:

ConnectSocket::~ConnectSocket() {

}